

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gguf.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  pair<int,_int> pVar8;
  ulong uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  FILE *__s;
  size_t sVar12;
  gguf_context *pgVar13;
  long lVar14;
  size_type __n;
  size_type sVar15;
  gguf_context **ppgVar16;
  char *pcVar17;
  uint uVar18;
  random_gguf_context_result result;
  random_device rd;
  undefined2 local_144a;
  undefined1 local_1448 [16];
  gguf_context *local_1438;
  ggml_backend_t local_1428;
  undefined4 local_1420;
  allocator_type local_1419;
  ulong local_1418;
  gguf_context *local_1410;
  gguf_context *local_1408;
  long local_1400;
  gguf_context *local_13f8;
  gguf_context *local_13f0;
  gguf_context *local_13e8;
  pair<int,_int> local_13e0;
  uint local_13d4;
  ulong local_13d0;
  FILE *local_13c8;
  gguf_context *local_13c0;
  random_device local_13b8;
  
  if (argc < 3) {
    std::random_device::random_device(&local_13b8);
    if (argc == 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1448,argv[1],(allocator<char> *)&local_144a);
      uVar10 = local_1448._0_8_;
      piVar6 = __errno_location();
      iVar4 = *piVar6;
      *piVar6 = 0;
      lVar7 = strtol((char *)uVar10,(char **)&local_13f0,10);
      if (local_13f0 == (gguf_context *)uVar10) {
        std::__throw_invalid_argument("stoi");
LAB_00104245:
        uVar10 = std::__throw_out_of_range("stoi");
        std::random_device::_M_fini();
        _Unwind_Resume(uVar10);
      }
      local_1400 = lVar7;
      if (((int)lVar7 != lVar7) || (*piVar6 == 0x22)) goto LAB_00104245;
      if (*piVar6 == 0) {
        *piVar6 = iVar4;
      }
      if ((gguf_context *)local_1448._0_8_ != (gguf_context *)&local_1438) {
        operator_delete((void *)local_1448._0_8_,(ulong)(local_1438 + 1));
      }
    }
    else {
      local_1400 = std::random_device::_M_getval();
    }
    ggml_backend_dev_count();
    fputc(10,_stderr);
    uVar18 = (uint)local_1400;
    pVar8 = test_handcrafted_file(uVar18);
    local_1418 = (ulong)pVar8 >> 0x20;
    local_13d4 = uVar18 + 1;
    local_13d0 = 0;
    while (uVar9 = ggml_backend_dev_count(), local_13d0 < uVar9) {
      local_13e0 = pVar8;
      local_13f8 = (gguf_context *)ggml_backend_dev_get();
      local_144a = 1;
      lVar7 = 0;
      do {
        local_13e8 = (gguf_context *)lVar7;
        bVar3 = *(bool *)((long)&local_144a + lVar7);
        local_1428 = (ggml_backend_t)ggml_backend_dev_init(local_13f8,0);
        uVar10 = ggml_backend_dev_description(local_13f8);
        uVar11 = ggml_backend_name(local_1428);
        pcVar17 = "no";
        if (bVar3 != false) {
          pcVar17 = "yes";
        }
        printf("%s: device=%s, backend=%s, only_meta=%s\n","test_roundtrip",uVar10,uVar11,pcVar17);
        get_random_gguf_context
                  ((random_gguf_context_result *)local_1448,local_1428,(uint)local_1400);
        pgVar13 = local_1438;
        uVar10 = local_1448._0_8_;
        local_1408 = (gguf_context *)local_1448._8_8_;
        __s = tmpfile();
        if (__s == (FILE *)0x0) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-gguf.cpp"
                     ,0x446,"GGML_ASSERT(%s) failed","file");
        }
        local_1448._0_8_ = (gguf_context *)0x0;
        local_1448._8_8_ = (gguf_context *)0x0;
        local_1438 = (gguf_context *)0x0;
        gguf_write_to_buf((gguf_context *)uVar10,(vector *)local_1448,bVar3);
        sVar12 = fwrite((void *)local_1448._0_8_,1,local_1448._8_8_ - local_1448._0_8_,__s);
        if (sVar12 != local_1448._8_8_ - local_1448._0_8_) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-gguf.cpp"
                     ,0x44c,"GGML_ASSERT(%s) failed",
                     "fwrite(buf.data(), 1, buf.size(), file) == buf.size()");
        }
        local_13c0 = pgVar13;
        rewind(__s);
        if ((gguf_context *)local_1448._0_8_ != (gguf_context *)0x0) {
          operator_delete((void *)local_1448._0_8_,(long)local_1438 - local_1448._0_8_);
        }
        local_13f0 = (gguf_context *)0x0;
        ppgVar16 = &local_13f0;
        if (bVar3 != false) {
          ppgVar16 = (gguf_context **)0x0;
        }
        auVar1._8_8_ = 0;
        auVar1._0_8_ = ppgVar16;
        local_13c8 = __s;
        pgVar13 = (gguf_context *)gguf_init_from_file_impl(__s,(gguf_init_params)(auVar1 << 0x40));
        printf("%s: same_version: ","test_roundtrip");
        iVar4 = gguf_get_version(uVar10);
        iVar5 = gguf_get_version(pgVar13);
        pcVar17 = "\x1b[1;31mFAIL\x1b[0m";
        if (iVar4 == iVar5) {
          pcVar17 = "\x1b[1;32mOK\x1b[0m";
        }
        puts(pcVar17);
        printf("%s: same_n_kv: ","test_roundtrip");
        lVar7 = gguf_get_n_kv(uVar10);
        lVar14 = gguf_get_n_kv(pgVar13);
        if (lVar7 == lVar14) {
          puts("\x1b[1;32mOK\x1b[0m");
          uVar18 = (iVar4 == iVar5) + 1;
        }
        else {
          uVar18 = (uint)(iVar4 == iVar5);
          puts("\x1b[1;31mFAIL\x1b[0m");
        }
        printf("%s: same_n_tensors: ","test_roundtrip");
        lVar7 = gguf_get_n_tensors(uVar10);
        lVar14 = gguf_get_n_tensors(pgVar13);
        if (lVar7 == lVar14) {
          puts("\x1b[1;32mOK\x1b[0m");
          uVar18 = uVar18 + 1;
        }
        else {
          puts("\x1b[1;31mFAIL\x1b[0m");
        }
        printf("%s: all_orig_kv_in_read: ","test_roundtrip");
        bVar2 = all_kv_in_other((gguf_context *)uVar10,pgVar13);
        if (bVar2) {
          puts("\x1b[1;32mOK\x1b[0m");
          uVar18 = uVar18 + 1;
        }
        else {
          puts("\x1b[1;31mFAIL\x1b[0m");
        }
        printf("%s: all_read_kv_in_orig: ","test_roundtrip");
        bVar2 = all_kv_in_other(pgVar13,(gguf_context *)uVar10);
        if (bVar2) {
          puts("\x1b[1;32mOK\x1b[0m");
          uVar18 = uVar18 + 1;
        }
        else {
          puts("\x1b[1;31mFAIL\x1b[0m");
        }
        printf("%s: all_orig_tensors_in_read: ","test_roundtrip");
        bVar2 = all_tensors_in_other((gguf_context *)uVar10,pgVar13);
        if (bVar2) {
          puts("\x1b[1;32mOK\x1b[0m");
          uVar18 = uVar18 + 1;
        }
        else {
          puts("\x1b[1;31mFAIL\x1b[0m");
        }
        printf("%s: all_read_tensors_in_orig: ","test_roundtrip");
        bVar2 = all_tensors_in_other(pgVar13,(gguf_context *)uVar10);
        if (bVar2) {
          puts("\x1b[1;32mOK\x1b[0m");
          uVar18 = uVar18 + 1;
        }
        else {
          puts("\x1b[1;31mFAIL\x1b[0m");
        }
        iVar4 = 7;
        if (bVar3 == false) {
          printf("%s: same_tensor_data: ","test_roundtrip");
          local_1410 = local_13f0;
          lVar7 = ggml_get_first_tensor(local_1408);
          lVar14 = ggml_get_first_tensor(local_1410);
          local_1448._0_8_ = &local_1438;
          sVar12 = strlen((char *)(lVar14 + 0x100));
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1448,(char *)(lVar14 + 0x100),sVar12 + lVar14 + 0x100);
          iVar4 = std::__cxx11::string::compare(local_1448);
          if ((gguf_context *)local_1448._0_8_ != (gguf_context *)&local_1438) {
            operator_delete((void *)local_1448._0_8_,(ulong)(local_1438 + 1));
          }
          if (iVar4 == 0) {
            lVar14 = ggml_get_next_tensor(local_1410);
            local_1420 = (undefined4)CONCAT71((int7)((ulong)lVar14 >> 8),1);
            while (lVar7 != 0) {
              if (lVar14 == 0) goto LAB_00103d75;
              __n = ggml_nbytes(lVar7);
              sVar15 = ggml_nbytes(lVar14);
              if (sVar15 != __n) goto LAB_00103d75;
              std::vector<char,_std::allocator<char>_>::vector
                        ((vector<char,_std::allocator<char>_> *)local_1448,__n,&local_1419);
              ggml_backend_tensor_get(lVar7,local_1448._0_8_,0,__n);
              if ((__n != 0) &&
                 (iVar4 = bcmp((void *)local_1448._0_8_,*(void **)(lVar14 + 0xf8),__n), iVar4 != 0))
              {
                local_1420 = 0;
              }
              lVar7 = ggml_get_next_tensor(local_1408,lVar7);
              lVar14 = ggml_get_next_tensor(local_1410);
              if ((gguf_context *)local_1448._0_8_ != (gguf_context *)0x0) {
                operator_delete((void *)local_1448._0_8_,(long)local_1438 - local_1448._0_8_);
              }
            }
            if ((lVar14 == 0 & (byte)local_1420) != 1) goto LAB_00103d75;
            puts("\x1b[1;32mOK\x1b[0m");
            uVar18 = uVar18 + 1;
          }
          else {
LAB_00103d75:
            puts("\x1b[1;31mFAIL\x1b[0m");
          }
          iVar4 = 8;
        }
        ggml_backend_buffer_free(local_13c0);
        ggml_free(local_1408);
        ggml_free(local_13f0);
        gguf_free(uVar10);
        gguf_free(pgVar13);
        ggml_backend_free(local_1428);
        fclose(local_13c8);
        putchar(10);
        pgVar13 = local_13f8;
        local_13e0.first = local_13e0.first + uVar18;
        local_13e0.second = 0;
        local_1418 = (ulong)(uint)((int)local_1418 + iVar4);
        lVar7 = (long)local_13e8 + 1;
      } while (lVar7 != 2);
      local_1428 = (ggml_backend_t)ggml_backend_dev_init(local_13f8,0);
      uVar10 = ggml_backend_dev_description(pgVar13);
      uVar11 = ggml_backend_name(local_1428);
      printf("%s: device=%s, backend=%s\n","test_gguf_set_kv",uVar10,uVar11);
      get_random_gguf_context((random_gguf_context_result *)local_1448,local_1428,(uint)local_1400);
      uVar10 = local_1448._0_8_;
      local_1410 = (gguf_context *)local_1448._8_8_;
      local_1408 = local_1438;
      get_random_gguf_context((random_gguf_context_result *)local_1448,local_1428,local_13d4);
      uVar11 = local_1448._0_8_;
      local_13e8 = (gguf_context *)local_1448._8_8_;
      local_13f8 = local_1438;
      pgVar13 = (gguf_context *)gguf_init_empty();
      gguf_set_kv(uVar11,uVar10);
      gguf_set_kv(pgVar13,uVar10);
      printf("%s: same_n_kv: ","test_gguf_set_kv");
      lVar7 = gguf_get_n_kv(uVar10);
      lVar14 = gguf_get_n_kv(pgVar13);
      pcVar17 = "\x1b[1;31mFAIL\x1b[0m";
      if (lVar7 == lVar14) {
        pcVar17 = "\x1b[1;32mOK\x1b[0m";
      }
      puts(pcVar17);
      printf("%s: all_kv_0_in_1: ","test_gguf_set_kv");
      bVar3 = all_kv_in_other((gguf_context *)uVar10,(gguf_context *)uVar11);
      if (bVar3) {
        puts("\x1b[1;32mOK\x1b[0m");
        uVar18 = (lVar7 == lVar14) + 1;
      }
      else {
        uVar18 = (uint)(lVar7 == lVar14);
        puts("\x1b[1;31mFAIL\x1b[0m");
      }
      printf("%s: all_kv_0_in_2: ","test_gguf_set_kv");
      bVar3 = all_kv_in_other((gguf_context *)uVar10,pgVar13);
      if (bVar3) {
        puts("\x1b[1;32mOK\x1b[0m");
        uVar18 = uVar18 + 1;
      }
      else {
        puts("\x1b[1;31mFAIL\x1b[0m");
      }
      gguf_set_kv(uVar10,uVar11);
      printf("%s: same_n_kv_after_double_copy: ","test_gguf_set_kv");
      lVar7 = gguf_get_n_kv(uVar10);
      lVar14 = gguf_get_n_kv(uVar11);
      if (lVar7 == lVar14) {
        puts("\x1b[1;32mOK\x1b[0m");
        uVar18 = uVar18 + 1;
      }
      else {
        puts("\x1b[1;31mFAIL\x1b[0m");
      }
      printf("%s: all_kv_1_in_0_after_double_copy: ","test_gguf_set_kv");
      bVar3 = all_kv_in_other((gguf_context *)uVar11,(gguf_context *)uVar10);
      if (bVar3) {
        puts("\x1b[1;32mOK\x1b[0m");
        uVar18 = uVar18 + 1;
      }
      else {
        puts("\x1b[1;31mFAIL\x1b[0m");
      }
      ggml_backend_buffer_free(local_1408);
      ggml_backend_buffer_free(local_13f8);
      ggml_free(local_1410);
      ggml_free(local_13e8);
      gguf_free(uVar10);
      gguf_free(uVar11);
      gguf_free(pgVar13);
      ggml_backend_free(local_1428);
      putchar(10);
      pVar8.first = local_13e0.first + uVar18;
      pVar8.second = 0;
      local_1418 = (ulong)((int)local_1418 + 5);
      local_13d0 = local_13d0 + 1;
    }
    iVar4 = (int)local_1418;
    printf("%d/%d tests passed\n",(ulong)pVar8 & 0xffffffff,local_1418 & 0xffffffff);
    pcVar17 = "\x1b[1;32mOK\x1b[0m";
    if (pVar8.first != iVar4) {
      pcVar17 = "\x1b[1;31mFAIL\x1b[0m";
    }
    puts(pcVar17);
    std::random_device::_M_fini();
    uVar18 = (uint)(pVar8.first != iVar4);
  }
  else {
    puts("usage: test-gguf [seed]");
    puts("  if no seed is unspecified then a random seed is used");
    uVar18 = 1;
  }
  return uVar18;
}

Assistant:

int main(int argc, char ** argv) {
    if (argc > 2) {
        print_usage();
        return 1;
    }

    std::random_device rd;
    const unsigned int seed = argc < 2 ? rd() : std::stoi(argv[1]);

    // Initialize ggml backends early so the prints aren't interleaved with the test results:
    ggml_backend_dev_count();
    fprintf(stderr, "\n");

    int npass = 0;
    int ntest = 0;
    {
        std::pair<int, int> result = test_handcrafted_file(seed);
        npass += result.first;
        ntest += result.second;
    }

    for (size_t i = 0; i < ggml_backend_dev_count(); ++i) {
        ggml_backend_dev_t dev = ggml_backend_dev_get(i);

        for (bool only_meta : {true, false}) {
            std::pair<int, int> result = test_roundtrip(dev, seed, only_meta);
            npass += result.first;
            ntest += result.second;
        }

        {
            std::pair<int, int> result = test_gguf_set_kv(dev, seed);
            npass += result.first;
            ntest += result.second;
        }
    }

    printf("%d/%d tests passed\n", npass, ntest);
    if (npass != ntest) {
        printf("\033[1;31mFAIL\033[0m\n");
        return 1;
    }
    printf("\033[1;32mOK\033[0m\n");
    return 0;
}